

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

token_t __thiscall grammar::add_nonterminal(grammar *this,symbol_t *symbol,token_t nonterm)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  token_t tVar3;
  _Base_ptr p_Var4;
  mapped_type *lhs;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  strong_t<int,_grammar::token_tag> local_24;
  
  p_Var4 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_24.internal_rep = nonterm.internal_rep;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (nonterm.internal_rep <= (int)p_Var4[1]._M_color) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < nonterm.internal_rep];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= nonterm.internal_rep))
    {
      lhs = std::
            map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
            ::at(&this->symbols,&local_24);
      bVar2 = operator==(lhs,symbol);
      if (bVar2) {
        return (token_t)local_24.internal_rep;
      }
      p_Var5 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var5 == p_Var1) {
          tVar3 = get_nonterminal(this,symbol);
          return (token_t)tVar3.internal_rep;
        }
        bVar2 = operator==((this_t *)&p_Var5[1]._M_parent,symbol);
        if (bVar2) break;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      }
      return (token_t)p_Var5[1]._M_color;
    }
  }
  std::
  _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
  ::
  _M_emplace_unique<strong_t<int,grammar::token_tag>&,strong_t<std::__cxx11::string,grammar::symbol_tag>const&>
            ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
              *)this,&local_24,symbol);
  return (token_t)local_24.internal_rep;
}

Assistant:

token_t grammar::add_nonterminal(const symbol_t & symbol, token_t nonterm) {
    if (symbols.count(nonterm) == 0) {
        symbols.emplace(nonterm, symbol);
        return nonterm;
    } else if (symbols.at(nonterm) == symbol)
        return nonterm;

    for (auto & entry : symbols)
        if (entry.second == symbol) return entry.first;

    return this->get_nonterminal(symbol);
}